

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

ByteData * cfd::core::CreatePsbtOutputOnlyData(ByteData *__return_storage_ptr__,wally_psbt *psbt)

{
  wally_psbt_output *pwVar1;
  wally_map_item *pwVar2;
  uint32_t *buffer;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  Serializer builder;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tx;
  Serializer local_90;
  wally_psbt *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ByteData local_48;
  
  Serializer::Serializer(&local_90);
  Serializer::AddDirectBytes(&local_90,psbt->magic,5);
  Serializer::AddDirectByte(&local_90,'\x01');
  Serializer::AddVariableInt(&local_90,0);
  ConvertBitcoinTxFromWally(&local_48,psbt->tx,false);
  ByteData::GetBytes(&local_60,&local_48);
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  Serializer::AddVariableBuffer
            (&local_90,
             local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (int)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
             (int)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start);
  if (psbt->version != 0) {
    Serializer::AddDirectByte(&local_90,'\x01');
    Serializer::AddVariableInt(&local_90,0xfb);
    buffer = (uint32_t *)operator_new(4);
    *buffer = psbt->version;
    Serializer::AddVariableBuffer(&local_90,(uint8_t *)buffer,4);
    operator_delete(buffer);
  }
  if ((psbt->unknowns).num_items != 0) {
    lVar4 = 0x18;
    uVar5 = 0;
    do {
      pwVar2 = (psbt->unknowns).items;
      Serializer::AddVariableBuffer
                (&local_90,*(uint8_t **)((long)pwVar2 + lVar4 + -0x18),
                 *(uint32_t *)((long)pwVar2 + lVar4 + -0x10));
      Serializer::AddVariableBuffer
                (&local_90,*(uint8_t **)((long)pwVar2 + lVar4 + -8),
                 *(uint32_t *)((long)&pwVar2->key + lVar4));
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < (psbt->unknowns).num_items);
  }
  Serializer::AddDirectByte(&local_90,'\0');
  if (psbt->num_outputs != 0) {
    uVar5 = 0;
    local_68 = psbt;
    do {
      pwVar1 = local_68->outputs + uVar5;
      if (local_68->outputs[uVar5].redeem_script_len != 0) {
        Serializer::AddDirectByte(&local_90,'\x01');
        Serializer::AddVariableInt(&local_90,0);
        Serializer::AddVariableBuffer
                  (&local_90,pwVar1->redeem_script,(uint32_t)pwVar1->redeem_script_len);
      }
      if (pwVar1->witness_script_len != 0) {
        Serializer::AddDirectByte(&local_90,'\x01');
        Serializer::AddVariableInt(&local_90,1);
        Serializer::AddVariableBuffer
                  (&local_90,pwVar1->witness_script,(uint32_t)pwVar1->witness_script_len);
      }
      if ((pwVar1->keypaths).num_items != 0) {
        lVar4 = 0x18;
        uVar3 = 0;
        do {
          pwVar2 = (pwVar1->keypaths).items;
          Serializer::AddPrefixBuffer
                    (&local_90,2,*(uint8_t **)((long)pwVar2 + lVar4 + -0x18),
                     *(uint32_t *)((long)pwVar2 + lVar4 + -0x10));
          Serializer::AddVariableBuffer
                    (&local_90,*(uint8_t **)((long)pwVar2 + lVar4 + -8),
                     *(uint32_t *)((long)&pwVar2->key + lVar4));
          uVar3 = uVar3 + 1;
          lVar4 = lVar4 + 0x20;
        } while (uVar3 < (pwVar1->keypaths).num_items);
      }
      if ((pwVar1->unknowns).num_items != 0) {
        lVar4 = 0x18;
        uVar3 = 0;
        do {
          pwVar2 = (pwVar1->unknowns).items;
          Serializer::AddVariableBuffer
                    (&local_90,*(uint8_t **)((long)pwVar2 + lVar4 + -0x18),
                     *(uint32_t *)((long)pwVar2 + lVar4 + -0x10));
          Serializer::AddVariableBuffer
                    (&local_90,*(uint8_t **)((long)pwVar2 + lVar4 + -8),
                     *(uint32_t *)((long)&pwVar2->key + lVar4));
          uVar3 = uVar3 + 1;
          lVar4 = lVar4 + 0x20;
        } while (uVar3 < (pwVar1->unknowns).num_items);
      }
      Serializer::AddDirectByte(&local_90,'\0');
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_68->num_outputs);
  }
  Serializer::Output(__return_storage_ptr__,&local_90);
  if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  local_90._vptr_Serializer = (_func_int **)&PTR__Serializer_0067a778;
  if (local_90.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData CreatePsbtOutputOnlyData(const struct wally_psbt *psbt) {
  Serializer builder;
  builder.AddDirectBytes(psbt->magic, sizeof(psbt->magic));

  builder.AddDirectByte(1);
  builder.AddVariableInt(Psbt::kPsbtGlobalUnsignedTx);
  auto tx = ConvertBitcoinTxFromWally(psbt->tx, false).GetBytes();
  builder.AddVariableBuffer(tx.data(), static_cast<uint32_t>(tx.size()));

  if (psbt->version > 0) {
    builder.AddDirectByte(1);
    builder.AddVariableInt(Psbt::kPsbtGlobalVersion);
    std::vector<uint8_t> data(sizeof(psbt->version));
    memcpy(data.data(), &psbt->version, data.size());
    // TODO(k-matsuzawa) need endian support.
    builder.AddVariableBuffer(data.data(), sizeof(psbt->version));
  }

  for (size_t i = 0; i < psbt->unknowns.num_items; ++i) {
    auto *item = &psbt->unknowns.items[i];
    builder.AddVariableBuffer(item->key, static_cast<uint32_t>(item->key_len));
    builder.AddVariableBuffer(
        item->value, static_cast<uint32_t>(item->value_len));
  }
  builder.AddDirectByte(kPsbtSeparator);

  // input is unsupport.

  for (size_t i = 0; i < psbt->num_outputs; ++i) {
    WritePsbtOutput(&builder, &psbt->outputs[i]);
  }
  return builder.Output();
}